

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O1

void __thiscall GibbsSamplerFromHDP::deleteK(GibbsSamplerFromHDP *this,uint k)

{
  pointer *ppuVar1;
  uint uVar2;
  pointer puVar3;
  pointer pvVar4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  
  if (this->_J != 0) {
    puVar3 = (this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar4 = (this->_kjt).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      if (puVar3[uVar7] != 0) {
        lVar5 = *(long *)&pvVar4[uVar7].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        uVar9 = 0;
        do {
          uVar2 = *(uint *)(lVar5 + uVar9 * 4);
          if (k < uVar2) {
            *(uint *)(lVar5 + uVar9 * 4) = uVar2 - 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < puVar3[uVar7]);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->_J);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_erase(&this->_nkv,
             (this->_nkv).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + k);
  puVar3 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = puVar3 + (ulong)k + 1;
  if (puVar8 != puVar6) {
    memmove(puVar3 + k,puVar8,(long)puVar6 - (long)puVar8);
  }
  ppuVar1 = &(this->_nk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  puVar3 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = puVar3 + (ulong)k + 1;
  if (puVar8 != puVar6) {
    memmove(puVar3 + k,puVar8,(long)puVar6 - (long)puVar8);
  }
  ppuVar1 = &(this->_mk).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  this->_K = this->_K - 1;
  return;
}

Assistant:

void GibbsSamplerFromHDP::deleteK(unsigned int k){//{{{
    for(int j=0; j<_J; j++){
        for(int t=0; t<_Tj[j]; t++){
            if(_kjt[j][t] > k) _kjt[j][t]--;
        }
    }
    _nkv.erase(_nkv.begin() + k);
    _nk.erase(_nk.begin() + k);
    _mk.erase(_mk.begin() + k);
    _K--;
}